

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.cpp
# Opt level: O0

size_t miniscript::internal::ComputeScriptLen
                 (Fragment fragment,Type sub0typ,size_t subsize,uint32_t k,size_t n_subs,
                 size_t n_keys,MiniscriptContext ms_ctx)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  ulong in_RDX;
  undefined4 in_EDI;
  long in_R8;
  long in_R9;
  long in_FS_OFFSET;
  MiniscriptContext in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  Type *in_stack_fffffffffffffea0;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffea8;
  unsigned_long *in_stack_fffffffffffffec8;
  ulong local_c0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_EDI) {
  case 0:
  case 1:
    local_c0 = 1;
    break;
  case 2:
    bVar2 = IsTapscript(in_stack_fffffffffffffe98);
    iVar3 = 0x22;
    if (bVar2) {
      iVar3 = 0x21;
    }
    local_c0 = (ulong)iVar3;
    break;
  case 3:
    local_c0 = 0x18;
    break;
  case 4:
  case 5:
    BuildScript<unsigned_int&>((uint *)in_stack_fffffffffffffec8);
    sVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_fffffffffffffea8);
    local_c0 = (ulong)(sVar5 + 1);
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    break;
  case 6:
  case 7:
    local_c0 = 0x27;
    break;
  case 8:
  case 9:
    local_c0 = 0x1b;
    break;
  case 10:
  case 0x14:
    local_c0 = in_RDX + 2;
    break;
  case 0xb:
  case 0xc:
  case 0x10:
  case 0x12:
  case 0x13:
    local_c0 = in_RDX + 1;
    break;
  case 0xd:
  case 0x15:
  case 0x16:
  case 0x17:
    local_c0 = in_RDX + 3;
    break;
  case 0xe:
    bVar2 = Type::operator<<(in_stack_fffffffffffffea0,
                             (Type)(uint32_t)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    local_c0 = in_RDX + bVar2;
    break;
  case 0xf:
    local_c0 = in_RDX + 4;
    break;
  case 0x11:
    local_c0 = in_RDX;
    break;
  case 0x18:
    BuildScript<unsigned_int&>((uint *)in_stack_fffffffffffffec8);
    sVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_fffffffffffffea8);
    local_c0 = in_RDX + in_R8 + (ulong)sVar5;
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    break;
  case 0x19:
    BuildScript<unsigned_long&>(in_stack_fffffffffffffec8);
    sVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_fffffffffffffea8);
    BuildScript<unsigned_int&>((uint *)in_stack_fffffffffffffec8);
    sVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_fffffffffffffea8);
    local_c0 = (ulong)(sVar5 + 1 + sVar4) + in_R9 * 0x22;
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    break;
  case 0x1a:
    BuildScript<unsigned_int&>((uint *)in_stack_fffffffffffffec8);
    sVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_fffffffffffffea8);
    local_c0 = in_R9 * 0x22 + (ulong)sVar5 + 1;
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                  ,0x125,
                  "size_t miniscript::internal::ComputeScriptLen(Fragment, Type, size_t, uint32_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c0;
}

Assistant:

size_t ComputeScriptLen(Fragment fragment, Type sub0typ, size_t subsize, uint32_t k, size_t n_subs,
                        size_t n_keys, MiniscriptContext ms_ctx) {
    switch (fragment) {
        case Fragment::JUST_1:
        case Fragment::JUST_0: return 1;
        case Fragment::PK_K: return IsTapscript(ms_ctx) ? 33 : 34;
        case Fragment::PK_H: return 3 + 21;
        case Fragment::OLDER:
        case Fragment::AFTER: return 1 + BuildScript(k).size();
        case Fragment::HASH256:
        case Fragment::SHA256: return 4 + 2 + 33;
        case Fragment::HASH160:
        case Fragment::RIPEMD160: return 4 + 2 + 21;
        case Fragment::MULTI: return 1 + BuildScript(n_keys).size() + BuildScript(k).size() + 34 * n_keys;
        case Fragment::MULTI_A: return (1 + 32 + 1) * n_keys + BuildScript(k).size() + 1;
        case Fragment::AND_V: return subsize;
        case Fragment::WRAP_V: return subsize + (sub0typ << "x"_mst);
        case Fragment::WRAP_S:
        case Fragment::WRAP_C:
        case Fragment::WRAP_N:
        case Fragment::AND_B:
        case Fragment::OR_B: return subsize + 1;
        case Fragment::WRAP_A:
        case Fragment::OR_C: return subsize + 2;
        case Fragment::WRAP_D:
        case Fragment::OR_D:
        case Fragment::OR_I:
        case Fragment::ANDOR: return subsize + 3;
        case Fragment::WRAP_J: return subsize + 4;
        case Fragment::THRESH: return subsize + n_subs + BuildScript(k).size();
    }
    assert(false);
}